

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

void phosg::freadx(FILE *f,void *data,size_t size)

{
  int iVar1;
  io_error *piVar2;
  string local_58;
  size_t local_28;
  ssize_t ret_size;
  size_t size_local;
  void *data_local;
  FILE *f_local;
  
  ret_size = size;
  size_local = (size_t)data;
  data_local = f;
  local_28 = ::fread(data,1,size,(FILE *)f);
  if ((long)local_28 < 0) {
    piVar2 = (io_error *)__cxa_allocate_exception(0x20);
    iVar1 = fileno((FILE *)data_local);
    io_error::io_error(piVar2,iVar1);
    __cxa_throw(piVar2,&io_error::typeinfo,io_error::~io_error);
  }
  if (local_28 != ret_size) {
    piVar2 = (io_error *)__cxa_allocate_exception(0x20);
    iVar1 = fileno((FILE *)data_local);
    string_printf_abi_cxx11_(&local_58,"expected %zu bytes, read %zd bytes",ret_size,local_28);
    io_error::io_error(piVar2,iVar1,(string *)&local_58);
    __cxa_throw(piVar2,&io_error::typeinfo,io_error::~io_error);
  }
  return;
}

Assistant:

void freadx(FILE* f, void* data, size_t size) {
  ssize_t ret_size = ::fread(data, 1, size, f);
  if (ret_size < 0) {
    throw io_error(fileno(f));
  } else if (ret_size != static_cast<ssize_t>(size)) {
    throw io_error(fileno(f), string_printf("expected %zu bytes, read %zd bytes", size, ret_size));
  }
}